

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

void jsgf_add_link(jsgf_t *grammar,jsgf_atom_t *atom,int from,int to)

{
  undefined8 *ptr;
  glist_t pgVar1;
  
  ptr = (undefined8 *)
        __ckd_calloc__(1,0x10,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                       ,0xc1);
  *(int *)(ptr + 1) = from;
  *(int *)((long)ptr + 0xc) = to;
  *ptr = atom;
  pgVar1 = glist_add_ptr(grammar->links,ptr);
  grammar->links = pgVar1;
  return;
}

Assistant:

void
jsgf_add_link(jsgf_t * grammar, jsgf_atom_t * atom, int from, int to)
{
    jsgf_link_t *link;

    link = ckd_calloc(1, sizeof(*link));
    link->from = from;
    link->to = to;
    link->atom = atom;
    grammar->links = glist_add_ptr(grammar->links, link);
}